

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scope.cpp
# Opt level: O2

Diagnostic * __thiscall
slang::ast::Scope::addDiag(Scope *this,DiagCode code,SourceLocation location)

{
  Compilation *this_00;
  Diagnostic *pDVar1;
  Diagnostic local_80;
  
  this_00 = this->compilation;
  Diagnostic::Diagnostic(&local_80,this->thisSym,code,location);
  pDVar1 = Compilation::addDiag(this_00,&local_80);
  Diagnostic::~Diagnostic(&local_80);
  return pDVar1;
}

Assistant:

Diagnostic& Scope::addDiag(DiagCode code, SourceLocation location) const {
    return compilation.addDiag(Diagnostic(*thisSym, code, location));
}